

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O3

void __thiscall
henson::Coroutine<henson::Puppet>::Coroutine(Coroutine<henson::Puppet> *this,string *name)

{
  pointer pcVar1;
  string local_40;
  
  (this->super_BaseCoroutine).name_._M_dataplus._M_p =
       (pointer)&(this->super_BaseCoroutine).name_.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_BaseCoroutine).running_ = false;
  (this->super_BaseCoroutine).stop_ = 0;
  (this->super_BaseCoroutine).result_ = -1;
  (this->super_BaseCoroutine).total_time_ = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"henson","");
  spdlog::get((spdlog *)&this->log_,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  coro_stack_alloc(&this->stack_,0x800000);
  coro_create(&this->to_,Puppet::exec,this,(this->stack_).sptr,(this->stack_).ssze);
  coro_create(&this->from_,0,0,0,0);
  return;
}

Assistant:

Coroutine(const std::string& name):
                            BaseCoroutine(name)
                        {
#ifdef USE_BOOST
                            to_ = bc::callcc([this](context_t&& from)
                                  {
                                      from_ = std::move(from);
                                      from_ = from_.resume();
                                      Derived::exec(this);
                                      return std::move(from_);
                                  });
#else
                            coro_stack_alloc(&stack_, 8*1024*1024);     // 8MB stack
                            coro_create(&to_, Derived::exec, this, stack_.sptr, stack_.ssze);
                            coro_create(&from_, NULL, NULL, NULL, 0);
#endif
                        }